

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lattice.cpp
# Opt level: O0

void __thiscall
OpenMD::Lattice::getLatticePointsPos
          (Lattice *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *latticePos,
          int nx,int ny,int nz)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Vector<double,_3U> *pVVar4;
  int in_ECX;
  int in_EDX;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_RSI;
  long in_RDI;
  int in_R8D;
  double dVar5;
  int i;
  size_type in_stack_ffffffffffffffa8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_ffffffffffffffb0;
  undefined4 local_20;
  
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (local_20 = 0; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
    pdVar3 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x10),0);
    dVar5 = *pdVar3;
    pVVar4 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)(in_RDI + 0x28),(long)local_20)->super_Vector<double,_3U>;
    pdVar3 = Vector<double,_3U>::operator[](pVVar4,0);
    dVar1 = *pdVar3;
    pdVar3 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x58),0);
    dVar2 = *pdVar3;
    pVVar4 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator[](in_RSI,(long)local_20)->super_Vector<double,_3U>;
    pdVar3 = Vector<double,_3U>::operator[](pVVar4,0);
    *pdVar3 = dVar2 * ((double)in_EDX - 0.5) + dVar5 + dVar1;
    pdVar3 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x10),1);
    dVar5 = *pdVar3;
    pVVar4 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)(in_RDI + 0x28),(long)local_20)->super_Vector<double,_3U>;
    pdVar3 = Vector<double,_3U>::operator[](pVVar4,1);
    dVar5 = dVar5 + *pdVar3;
    pdVar3 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x58),1);
    dVar1 = *pdVar3;
    pVVar4 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator[](in_RSI,(long)local_20)->super_Vector<double,_3U>;
    pdVar3 = Vector<double,_3U>::operator[](pVVar4,1);
    *pdVar3 = dVar1 * ((double)in_ECX - 0.5) + dVar5;
    pdVar3 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x10),2);
    dVar5 = *pdVar3;
    pVVar4 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)(in_RDI + 0x28),(long)local_20)->super_Vector<double,_3U>;
    pdVar3 = Vector<double,_3U>::operator[](pVVar4,2);
    dVar1 = *pdVar3;
    pdVar3 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x58),2);
    dVar2 = *pdVar3;
    pVVar4 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator[](in_RSI,(long)local_20)->super_Vector<double,_3U>;
    pdVar3 = Vector<double,_3U>::operator[](pVVar4,2);
    *pdVar3 = dVar2 * ((double)in_R8D - 0.5) + dVar5 + dVar1;
  }
  return;
}

Assistant:

void Lattice::getLatticePointsPos(std::vector<Vector3d>& latticePos, int nx,
                                    int ny, int nz) {
    latticePos.resize(nCellSites);

    for (int i = 0; i < nCellSites; i++) {
      latticePos[i][0] =
          origin[0] + cellSitesPos[i][0] + cellLen[0] * (RealType(nx) - 0.5);
      latticePos[i][1] =
          origin[1] + cellSitesPos[i][1] + cellLen[1] * (RealType(ny) - 0.5);
      latticePos[i][2] =
          origin[2] + cellSitesPos[i][2] + cellLen[2] * (RealType(nz) - 0.5);
    }
  }